

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_io.c
# Opt level: O1

int light_pcapng_to_file(char *file_name,light_pcapng pcapng)

{
  uint32_t *buf;
  __fd_t fd;
  size_t size;
  size_t local_20;
  
  buf = light_pcapng_to_memory(pcapng,&local_20);
  fd = light_open(file_name,LIGHT_OWRITE);
  light_write(fd,buf,local_20);
  light_close(fd);
  free(buf);
  return 0;
}

Assistant:

int light_pcapng_to_file(const char *file_name, const light_pcapng pcapng)
{
	size_t size;
	uint32_t *data = light_pcapng_to_memory(pcapng, &size);
	__fd_t fd = light_open(file_name, LIGHT_OWRITE);

	light_write(fd, data, size);
	light_close(fd);
	free(data);
	return LIGHT_SUCCESS;
}